

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfFormatter<wchar_t>::format
          (PrintfFormatter<wchar_t> *this,long writer,wchar_t *param_3)

{
  bool bVar1;
  uint arg_index;
  FormatError *this_00;
  wchar_t wVar2;
  wchar_t *str;
  wchar_t *pwVar3;
  Arg *pAVar4;
  Arg arg;
  wchar_t *local_88;
  FormatSpec local_80;
  long local_68;
  FormatSpec *local_60;
  Arg local_58;
  
  wVar2 = *param_3;
  if (wVar2 != L'\0') {
    pwVar3 = param_3;
    do {
      local_88 = param_3 + 1;
      if (wVar2 == L'%') {
        if (*local_88 == L'%') {
          if (pwVar3 != local_88) {
            Buffer<wchar_t>::append<wchar_t>(*(Buffer<wchar_t> **)(writer + 8),pwVar3,local_88);
          }
          pwVar3 = local_88 + 1;
          local_88 = pwVar3;
        }
        else {
          if (pwVar3 != param_3) {
            Buffer<wchar_t>::append<wchar_t>(*(Buffer<wchar_t> **)(writer + 8),pwVar3,param_3);
          }
          local_80.super_AlignSpec.super_WidthSpec.width_ = 0;
          local_80.super_AlignSpec.super_WidthSpec.fill_ = L' ';
          local_80.super_AlignSpec.align_ = ALIGN_RIGHT;
          local_80.flags_ = 0;
          local_80.precision_ = -1;
          local_80.type_ = '\0';
          arg_index = parse_header(this,&local_88,&local_80);
          pwVar3 = local_88;
          if (*local_88 == L'.') {
            if ((uint)(local_88[1] + L'\xffffffd0') < 10) {
              local_88 = local_88 + 1;
              local_80.precision_ = anon_unknown_1::parse_nonnegative_int<wchar_t>(&local_88);
              pwVar3 = local_88;
            }
            else {
              pwVar3 = local_88 + 1;
              if (local_88[1] == L'*') {
                local_88 = local_88 + 2;
                pAVar4 = (Arg *)this;
                get_arg(&local_58,this,local_88,0xffffffff);
                local_80.precision_ =
                     ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                               ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)
                                &local_58,pAVar4);
                pwVar3 = local_88;
              }
            }
          }
          local_88 = pwVar3;
          pAVar4 = (Arg *)this;
          get_arg(&local_58,this,local_88,arg_index);
          if (((local_80._8_8_ & 0x800000000) != 0) &&
             (bVar1 = ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                                ((ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> *)
                                 &local_58,pAVar4), bVar1)) {
            local_80._8_8_ = local_80._8_8_ & 0xfffffff7ffffffff;
          }
          if (local_80.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
            if ((int)local_58.type < 10) {
              local_80.super_AlignSpec.align_ = 4;
            }
            else {
              local_80.super_AlignSpec.super_WidthSpec.fill_ = L' ';
            }
          }
          pwVar3 = local_88 + 1;
          wVar2 = *local_88;
          if (wVar2 < L'l') {
            if (wVar2 != L'L') {
              if (wVar2 == L'h') {
                if (*pwVar3 == L'h') {
                  pwVar3 = local_88 + 2;
                  local_88 = local_88 + 2;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>
                              *)&local_58,(Arg *)(ulong)(uint)*pwVar3);
                  pwVar3 = local_88;
                }
                else {
                  local_88 = pwVar3;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                             &local_58,(Arg *)(ulong)(uint)*pwVar3);
                  pwVar3 = local_88;
                }
              }
              else {
                if (wVar2 == L'j') goto LAB_001bf235;
LAB_001bf263:
                ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<int>,_void>::visit
                          ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<int>,_void> *)
                           &local_58,(Arg *)(ulong)(uint)wVar2);
                pwVar3 = local_88;
              }
            }
          }
          else if (wVar2 == L'l') {
            wVar2 = *pwVar3;
            if (wVar2 != L'l') goto LAB_001bf237;
            pwVar3 = local_88 + 2;
            local_88 = local_88 + 2;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                       &local_58,(Arg *)(ulong)(uint)*pwVar3);
            pwVar3 = local_88;
          }
          else if (wVar2 == L't') {
LAB_001bf235:
            wVar2 = *pwVar3;
LAB_001bf237:
            local_88 = pwVar3;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_58
                       ,(Arg *)(ulong)(uint)wVar2);
            pwVar3 = local_88;
          }
          else {
            if (wVar2 != L'z') goto LAB_001bf263;
            local_88 = pwVar3;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                       &local_58,(Arg *)(ulong)(uint)*pwVar3);
            pwVar3 = local_88;
          }
          local_88 = pwVar3;
          wVar2 = *local_88;
          if (wVar2 == L'\0') {
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x1ec1db);
            __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_88 = local_88 + 1;
          local_80.type_ = (char)wVar2;
          if ((int)local_58.type < 8) {
            if (local_80.type_ == 'c') {
              ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                        ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)&local_58,
                         &local_58);
            }
            else if ((local_80.type_ == 'u') || (local_80.type_ == 'i')) {
              local_80.type_ = 'd';
            }
          }
          pwVar3 = local_88;
          local_68 = writer;
          local_60 = &local_80;
          ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void>::visit
                    ((ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void> *)&local_68,
                     &local_58);
        }
      }
      wVar2 = *local_88;
      param_3 = local_88;
    } while (wVar2 != L'\0');
    if (pwVar3 != local_88) {
      Buffer<wchar_t>::append<wchar_t>(*(Buffer<wchar_t> **)(writer + 8),pwVar3,local_88);
    }
  }
  return;
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = parse_nonnegative_int(s);
      } else if (*s == '*') {
        ++s;
        spec.precision_ = PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && IsZeroInt().visit(arg))
      spec.flags_ &= ~HASH_FLAG;
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      ArgConverter<int>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}